

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockaddr.c
# Opt level: O1

uint32_t nng_sockaddr_port(nng_sockaddr *sa)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((ushort)((short)*(undefined4 *)sa - 3U) < 2) {
    uVar1 = (uint)(ushort)((sa->s_in6).sa_port << 8 | (sa->s_in6).sa_port >> 8);
  }
  return uVar1;
}

Assistant:

uint32_t
nng_sockaddr_port(const nng_sockaddr *sa)
{
	uint16_t port16;
	switch (sa->s_family) {
	case NNG_AF_INET:
		NNI_GET16(&sa->s_in.sa_port, port16);
		return (port16);
	case NNG_AF_INET6:
		NNI_GET16(&sa->s_in6.sa_port, port16);
		return (port16);
	default:
		return (0);
	}
}